

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestLaunch.cxx
# Opt level: O1

bool __thiscall cmCTestLaunch::ScrapeLog(cmCTestLaunch *this,string *fname)

{
  pointer pRVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  RegularExpression *r;
  pointer pRVar5;
  string line;
  ifstream fin;
  string local_258;
  istream local_238 [520];
  
  LoadScrapeRules(this);
  std::ifstream::ifstream(local_238,(fname->_M_dataplus)._M_p,_S_in|_S_bin);
  local_258._M_dataplus._M_p = (pointer)&local_258.field_2;
  local_258._M_string_length = 0;
  local_258.field_2._M_local_buf[0] = '\0';
LAB_0018de2d:
  do {
    bVar2 = cmsys::SystemTools::GetLineFromStream(local_238,&local_258,(bool *)0x0,-1);
    if (!bVar2) goto LAB_0018dee0;
    if ((this->OptionFilterPrefix)._M_string_length != 0) {
      bVar3 = cmsys::SystemTools::StringStartsWith
                        (&local_258,(this->OptionFilterPrefix)._M_dataplus._M_p);
      if (bVar3) goto LAB_0018de2d;
    }
    pRVar1 = (this->RegexWarning).
             super__Vector_base<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (pRVar5 = (this->RegexWarning).
                  super__Vector_base<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_>
                  ._M_impl.super__Vector_impl_data._M_start; bVar3 = pRVar5 != pRVar1, bVar3;
        pRVar5 = pRVar5 + 1) {
      bVar4 = cmsys::RegularExpression::find(pRVar5,local_258._M_dataplus._M_p,&pRVar5->regmatch);
      if (bVar4) break;
    }
    if (bVar3) {
      pRVar1 = (this->RegexWarningSuppress).
               super__Vector_base<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      for (pRVar5 = (this->RegexWarningSuppress).
                    super__Vector_base<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_>
                    ._M_impl.super__Vector_impl_data._M_start; bVar3 = pRVar5 != pRVar1, bVar3;
          pRVar5 = pRVar5 + 1) {
        bVar4 = cmsys::RegularExpression::find(pRVar5,local_258._M_dataplus._M_p,&pRVar5->regmatch);
        if (bVar4) break;
      }
      if (!bVar3) {
LAB_0018dee0:
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_258._M_dataplus._M_p != &local_258.field_2) {
          operator_delete(local_258._M_dataplus._M_p,
                          CONCAT71(local_258.field_2._M_allocated_capacity._1_7_,
                                   local_258.field_2._M_local_buf[0]) + 1);
        }
        std::ifstream::~ifstream(local_238);
        return bVar2;
      }
    }
  } while( true );
}

Assistant:

bool cmCTestLaunch::ScrapeLog(std::string const& fname)
{
  this->LoadScrapeRules();

  // Look for log file lines matching warning expressions but not
  // suppression expressions.
  cmsys::ifstream fin(fname.c_str(), std::ios::in | std::ios::binary);
  std::string line;
  while (cmSystemTools::GetLineFromStream(fin, line)) {
    if (MatchesFilterPrefix(line)) {
      continue;
    }

    if (this->Match(line, this->RegexWarning) &&
        !this->Match(line, this->RegexWarningSuppress)) {
      return true;
    }
  }
  return false;
}